

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_environment.cpp
# Opt level: O2

void __thiscall license::os::ExecutionEnvironment::ExecutionEnvironment(ExecutionEnvironment *this)

{
  FILE *__stream;
  __ssize_t _Var1;
  char *pcVar2;
  char *pcVar3;
  istream *piVar4;
  long lVar5;
  CONTAINER_TYPE CVar6;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [16];
  char *line;
  int aiStack_218 [122];
  
  CpuInfo::CpuInfo(&this->m_cpu_info);
  DmiInfo::DmiInfo(&this->m_dmi_info);
  line = (char *)0x0;
  local_258 = (undefined1 *)0x0;
  __stream = fopen("/proc/self/cgroup","r");
  if (__stream != (FILE *)0x0) {
    CVar6 = NONE;
    while( true ) {
      _Var1 = getline(&line,(size_t *)&local_258,__stream);
      pcVar3 = line;
      if ((CVar6 != NONE) || (_Var1 == -1)) break;
      pcVar2 = strstr(line,"docker");
      pcVar3 = strstr(pcVar3,"lxc");
      if (pcVar3 == (char *)0x0) {
        CVar6 = (CONTAINER_TYPE)(pcVar2 != (char *)0x0);
      }
      else {
        CVar6 = LXC;
      }
    }
    free(line);
    fclose(__stream);
    if (CVar6 != NONE) goto LAB_00171e56;
  }
  std::ifstream::ifstream(&line,"/var/run/systemd/container",_S_in);
  CVar6 = NONE;
  if (*(int *)((long)aiStack_218 + *(long *)(line + -0x18)) == 0) {
    local_258 = local_248;
    local_250 = 0;
    local_248[0] = 0;
    CVar6 = DOCKER;
    do {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&line,(string *)&local_258);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) goto LAB_00171e3e;
      lVar5 = std::__cxx11::string::find((char *)&local_258,0x3a2f5a);
      if (lVar5 != -1) goto LAB_00171e3e;
      lVar5 = std::__cxx11::string::find((char *)&local_258,0x3a2f61);
    } while (lVar5 == -1);
    CVar6 = LXC;
LAB_00171e3e:
    std::__cxx11::string::~string((string *)&local_258);
  }
  std::ifstream::~ifstream(&line);
LAB_00171e56:
  this->m_container_type = CVar6;
  return;
}

Assistant:

ExecutionEnvironment::ExecutionEnvironment() : m_container_type(get_container_type()) {}